

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgeTag
ON_SubD::EdgeTagFromContext(uint edge_face_count,ON_SubDVertexTag v0_tag,ON_SubDVertexTag v1_tag)

{
  if (edge_face_count < 0x8000) {
    if (2 < edge_face_count || edge_face_count == 1) {
      return Crease;
    }
    if (v0_tag == Smooth || v1_tag == Smooth) {
      return (edge_face_count == 2 && v0_tag == Smooth) && v1_tag == Smooth;
    }
    if ((byte)(v1_tag - Smooth | v0_tag - Smooth) < 4) {
      return (edge_face_count == 2) << 2;
    }
  }
  return Unset;
}

Assistant:

ON_SubDEdgeTag ON_SubD::EdgeTagFromContext(
  unsigned int edge_face_count,
  const ON_SubDVertexTag v0_tag,
  const ON_SubDVertexTag v1_tag
)
{
  ON_SubDEdgeTag edge_tag = ON_SubDEdgeTag::Unset;

  for(;;)
  {
    if (edge_face_count > 0x7FFFU)
      break;

    if (1 == edge_face_count || edge_face_count >= 3 )
    {
      edge_tag = ON_SubDEdgeTag::Crease;
      break;
    }

    const bool bSmooth0 = ON_SubDVertexTag::Smooth == v0_tag;
    const bool bSmooth1 = ON_SubDVertexTag::Smooth == v1_tag;

    if ( bSmooth0 || bSmooth1 )
    {
      if ( 2 == edge_face_count && bSmooth0 && bSmooth1)
        edge_tag = ON_SubDEdgeTag::Smooth;
      break;
    }

    if ( ON_SubD::VertexTagIsSet(v0_tag) && ON_SubD::VertexTagIsSet(v1_tag) )
    {
      if (2 == edge_face_count)
        edge_tag = ON_SubDEdgeTag::SmoothX;
      break;
    }

    break;
  }

  return edge_tag;
}